

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Mprobe(int source,int tag,MPIABI_Comm comm,MPIABI_Message *message,MPIABI_Status *status)

{
  int iVar1;
  undefined4 in_register_0000003c;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Mprobe(CONCAT44(in_register_0000003c,source));
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Mprobe(
  int source,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Message * message,
  MPIABI_Status * status
) {
  return MPI_Mprobe(
    source,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Message *)(WPI_MessagePtr)message,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}